

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O0

uint32_t * pack25_8(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint32_t *out_local;
  uint32_t *in_local;
  uint32_t base_local;
  
  *out = *in - base;
  *out = (in[1] - base) * 0x2000000 | *out;
  puVar1 = out + 1;
  *puVar1 = in[1] - base >> 7;
  *puVar1 = (in[2] - base) * 0x40000 | *puVar1;
  puVar1 = out + 2;
  *puVar1 = in[2] - base >> 0xe;
  *puVar1 = (in[3] - base) * 0x800 | *puVar1;
  puVar1 = out + 3;
  *puVar1 = in[3] - base >> 0x15;
  *puVar1 = (in[4] - base) * 0x10 | *puVar1;
  *puVar1 = (in[5] - base) * 0x20000000 | *puVar1;
  puVar1 = out + 4;
  *puVar1 = in[5] - base >> 3;
  *puVar1 = (in[6] - base) * 0x400000 | *puVar1;
  puVar1 = out + 5;
  *puVar1 = in[6] - base >> 10;
  *puVar1 = (in[7] - base) * 0x8000 | *puVar1;
  out[6] = in[7] - base >> 0x11;
  return out + 7;
}

Assistant:

uint32_t * pack25_8( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out =  static_cast<uint32_t>((*in) -base)  ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  25 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 25  -  18 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  18 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 25  -  11 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  11 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 25  -  4 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  4 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  29 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 25  -  22 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  22 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 25  -  15 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  15 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 25  -  8 );
    ++in;

    return out + 1;
}